

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<char>::Matcher(Matcher<char> *this,char value)

{
  EqMatcher<char> EVar1;
  Matcher<char> *in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  EqMatcher<char> *in_stack_ffffffffffffffe8;
  
  internal::MatcherBase<char>::MatcherBase((MatcherBase<char> *)0x12704e);
  (in_RDI->super_MatcherBase<char>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_00268578;
  EVar1 = Eq<char>('\0');
  uVar2 = CONCAT13(EVar1.rhs_,(int3)in_stack_ffffffffffffffc0);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffe8);
  operator=((Matcher<char> *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),in_RDI);
  ~Matcher((Matcher<char> *)0x12709f);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }